

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::doCheck(QPDFJob *this,QPDF *pdf)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  Pipeline *pPVar5;
  element_type *__n;
  void *__buf;
  pointer this_00;
  Pl_Discard discard;
  QPDFWriter w;
  DiscardContents discard_contents;
  undefined1 local_b0 [48];
  QPDFWriter local_80;
  QPDFPageDocumentHelper local_70;
  ParserCallbacks local_50;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_48;
  
  QPDFLogger::getInfo((QPDFLogger *)local_b0,
                      SUB81((((this->m).
                              super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->log).
                            super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
  uVar1 = local_b0._0_8_;
  if ((element_type *)local_b0._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
  }
  pPVar5 = Pipeline::operator<<((Pipeline *)uVar1,"checking ");
  __n = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pPVar5 = Pipeline::operator<<
                     (pPVar5,(__n->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
  Pipeline::operator<<(pPVar5,"\n");
  ((pdf->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
   super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->check_mode = true;
  iVar4 = QPDF::getExtensionLevel(pdf);
  pPVar5 = Pipeline::operator<<((Pipeline *)uVar1,"PDF Version: ");
  QPDF::getPDFVersion_abi_cxx11_((string *)local_b0,pdf);
  Pipeline::operator<<(pPVar5,(string *)local_b0);
  if ((element_type *)local_b0._0_8_ != (element_type *)(local_b0 + 0x10)) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  if (0 < iVar4) {
    pPVar5 = Pipeline::operator<<((Pipeline *)uVar1," extension level ");
    iVar4 = QPDF::getExtensionLevel(pdf);
    Pipeline::operator<<(pPVar5,iVar4);
  }
  Pipeline::operator<<((Pipeline *)uVar1,"\n");
  showEncryption(this,pdf);
  bVar3 = QPDF::isLinearized(pdf);
  if (bVar3) {
    Pipeline::operator<<((Pipeline *)uVar1,"File is linearized\n");
    QPDF::checkLinearization(pdf);
  }
  else {
    Pipeline::operator<<((Pipeline *)uVar1,"File is not linearized\n");
  }
  QPDFWriter::QPDFWriter(&local_80,pdf);
  Pl_Discard::Pl_Discard((Pl_Discard *)local_b0);
  QPDFWriter::setOutputPipeline(&local_80,(Pipeline *)local_b0);
  iVar4 = 3;
  QPDFWriter::setDecodeLevel(&local_80,qpdf_dl_all);
  QPDFWriter::write(&local_80,iVar4,__buf,(size_t)__n);
  local_50._vptr_ParserCallbacks = (_func_int **)&PTR__ParserCallbacks_002ef860;
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_70,pdf);
  QPDFPageDocumentHelper::getAllPages(&local_48,&local_70);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_70);
  if (local_48.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this_00 = local_48.
              super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      QPDFPageObjectHelper::parseContents(this_00,&local_50);
      this_00 = this_00 + 1;
    } while (this_00 !=
             local_48.
             super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_48);
  Pl_Discard::~Pl_Discard((Pl_Discard *)local_b0);
  if (local_80.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  QPDF::getWarnings((vector<QPDFExc,_std::allocator<QPDFExc>_> *)local_b0,pdf);
  uVar2 = local_b0._8_8_;
  uVar1 = local_b0._0_8_;
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::~vector
            ((vector<QPDFExc,_std::allocator<QPDFExc>_> *)local_b0);
  if (uVar1 == uVar2) {
    QPDFLogger::getInfo((QPDFLogger *)local_b0,
                        SUB81((((this->m).
                                super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->log).
                              super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
    pPVar5 = Pipeline::operator<<
                       ((Pipeline *)local_b0._0_8_,
                        "No syntax or stream encoding errors found; the file may still contain\n");
    Pipeline::operator<<(pPVar5,"errors that qpdf cannot detect\n");
    if ((element_type *)local_b0._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
    }
  }
  else {
    ((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->warnings =
         true;
  }
  return;
}

Assistant:

void
QPDFJob::doCheck(QPDF& pdf)
{
    // Code below may set okay to false but not to true. We assume okay until we prove otherwise but
    // may continue to perform additional checks after finding errors.
    bool okay = true;
    auto& cout = *m->log->getInfo();
    cout << "checking " << m->infilename.get() << "\n";
    QPDF::JobSetter::setCheckMode(pdf, true);
    try {
        int extension_level = pdf.getExtensionLevel();
        cout << "PDF Version: " << pdf.getPDFVersion();
        if (extension_level > 0) {
            cout << " extension level " << pdf.getExtensionLevel();
        }
        cout << "\n";
        showEncryption(pdf);
        if (pdf.isLinearized()) {
            cout << "File is linearized\n";
            pdf.checkLinearization();
        } else {
            cout << "File is not linearized\n";
        }

        // Write the file to nowhere, uncompressing streams.  This causes full file traversal and
        // decoding of all streams we can decode.
        QPDFWriter w(pdf);
        Pl_Discard discard;
        w.setOutputPipeline(&discard);
        w.setDecodeLevel(qpdf_dl_all);
        w.write();

        // Parse all content streams
        DiscardContents discard_contents;
        int pageno = 0;
        for (auto& page: QPDFPageDocumentHelper(pdf).getAllPages()) {
            ++pageno;
            try {
                page.parseContents(&discard_contents);
            } catch (QPDFExc& e) {
                okay = false;
                *m->log->getError() << "ERROR: page " << pageno << ": " << e.what() << "\n";
            }
        }
    } catch (std::exception& e) {
        *m->log->getError() << "ERROR: " << e.what() << "\n";
        okay = false;
    }
    if (!okay) {
        throw std::runtime_error("errors detected");
    }

    if (!pdf.getWarnings().empty()) {
        m->warnings = true;
    } else {
        *m->log->getInfo()
            << "No syntax or stream encoding errors found; the file may still contain\n"
            << "errors that qpdf cannot detect\n";
    }
}